

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void riscv_tr_tb_stop(DisasContextBase *dcbase,CPUState *cpu)

{
  DisasJumpType DVar1;
  TCGContext_conflict11 *tcg_ctx_00;
  TCGContext_conflict11 *tcg_ctx;
  DisasContextBase *__mptr;
  DisasContext_conflict12 *ctx;
  CPUState *cpu_local;
  DisasContextBase *dcbase_local;
  
  tcg_ctx_00 = *(TCGContext_conflict11 **)(dcbase[2].pc_first + 0x2e8);
  DVar1 = dcbase->is_jmp;
  if (DVar1 == DISAS_TOO_MANY) {
    gen_goto_tb((DisasContext_conflict12 *)dcbase,0,dcbase->pc_next);
  }
  else if (DVar1 != DISAS_NORETURN) {
    if (DVar1 != DISAS_TARGET_6) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/translate.c"
                 ,0x397,(char *)0x0);
    }
    tcg_gen_movi_i64_riscv64(tcg_ctx_00,tcg_ctx_00->cpu_pc,dcbase->pc_next);
    gen_helper_uc_riscv_exit
              (*(TCGContext_conflict11 **)(dcbase[2].pc_first + 0x2e8),
               *(TCGv_ptr *)(*(long *)(dcbase[2].pc_first + 0x2e8) + 0x88f0));
  }
  return;
}

Assistant:

static void riscv_tr_tb_stop(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    switch (ctx->base.is_jmp) {
    case DISAS_TOO_MANY:
        gen_goto_tb(ctx, 0, ctx->base.pc_next);
        break;
    case DISAS_NORETURN:
        break;
    case DISAS_UC_EXIT:
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, ctx->base.pc_next);
        gen_helper_uc_riscv_exit(ctx->uc->tcg_ctx, ctx->uc->tcg_ctx->cpu_env);
        break;
    default:
        g_assert_not_reached();
    }
}